

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::TextureFilterCase::test
          (TextureFilterCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  TesterType tester;
  TestLog *pTVar1;
  pointer puVar2;
  bool bVar3;
  GLenum GVar4;
  int iVar5;
  long *plVar6;
  undefined8 *puVar7;
  size_type *psVar8;
  int ndx;
  int expected;
  long lVar9;
  ulong uVar10;
  undefined8 uVar11;
  ScopedLogSection section;
  vector<unsigned_int,_std::allocator<unsigned_int>_> values;
  GLint value;
  ScopedLogSection section_1;
  string local_108;
  ScopedLogSection local_e8;
  long local_e0;
  TestLog local_d8;
  long lStack_d0;
  string local_c8;
  string local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  uint local_4c;
  code *local_48;
  GLenum local_40;
  ScopedLogSection local_38;
  
  tester = (this->super_TextureTest).m_tester;
  bVar3 = isPureIntTester(tester);
  if (!bVar3) {
    bVar3 = isPureUintTester(tester);
    GVar4 = (this->super_TextureTest).m_pname;
    iVar5 = 0x2702;
    if (GVar4 != 0x2801) {
      iVar5 = 0;
    }
    expected = 0x2601;
    if (GVar4 != 0x2800) {
      expected = iVar5;
    }
    if (!bVar3) {
      pTVar1 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"Initial","");
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Initial","");
      tcu::ScopedLogSection::ScopedLogSection(&local_e8,pTVar1,&local_108,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      StateQueryUtil::verifyStateTextureParamInteger
                (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 expected,(this->super_TextureTest).m_type);
      tcu::TestLog::endSection(local_e8.m_log);
      bVar3 = false;
      goto LAB_0182dee1;
    }
  }
  bVar3 = true;
LAB_0182dee1:
  pTVar1 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"Set","");
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Set","");
  tcu::ScopedLogSection::ScopedLogSection(&local_38,pTVar1,&local_108,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_108._M_dataplus._M_p._0_4_ = 0x2600;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
            (&local_88,(iterator)0x0,(uint *)&local_108);
  local_108._M_dataplus._M_p._0_4_ = 0x2601;
  if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_88,
               (iterator)
               local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)&local_108);
  }
  else {
    *local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0x2601;
    local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  if ((this->super_TextureTest).m_pname == 0x2801) {
    local_108._M_dataplus._M_p._0_4_ = 0x2700;
    if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_88,
                 (iterator)
                 local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)&local_108);
    }
    else {
      *local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = 0x2700;
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_108._M_dataplus._M_p._0_4_ = 0x2702;
    if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_88,
                 (iterator)
                 local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)&local_108);
    }
    else {
      *local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = 0x2702;
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_108._M_dataplus._M_p._0_4_ = 0x2701;
    if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_88,
                 (iterator)
                 local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)&local_108);
    }
    else {
      *local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = 0x2701;
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_108._M_dataplus._M_p._0_4_ = 0x2703;
    if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_88,
                 (iterator)
                 local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)&local_108);
    }
    else {
      *local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = 0x2703;
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
  }
  iVar5 = (int)((ulong)((long)local_88.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_88.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 2);
  if (bVar3) {
    if (0 < iVar5) {
      lVar9 = 0;
      do {
        puVar2 = local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        bVar3 = isPureIntTester((this->super_TextureTest).m_tester);
        if (bVar3) {
          local_4c = puVar2[lVar9];
          glu::CallLogWrapper::glTexParameterIiv
                    (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                     (GLint *)&local_4c);
          GVar4 = glu::CallLogWrapper::glGetError(gl);
          if (GVar4 != 0) {
            local_70 = local_60;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Got Error ","");
            local_48 = glu::getErrorName;
            local_40 = GVar4;
            tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_a8,&local_48);
            uVar10 = 0xf;
            if (local_70 != local_60) {
              uVar10 = local_60[0];
            }
            if (uVar10 < local_a8._M_string_length + local_68) {
              uVar11 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                uVar11 = local_a8.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar11 < local_a8._M_string_length + local_68) goto LAB_0182e209;
              plVar6 = (long *)std::__cxx11::string::replace
                                         ((ulong)&local_a8,0,(char *)0x0,(ulong)local_70);
            }
            else {
LAB_0182e209:
              plVar6 = (long *)std::__cxx11::string::_M_append
                                         ((char *)&local_70,(ulong)local_a8._M_dataplus._M_p);
            }
            pTVar1 = (TestLog *)(plVar6 + 2);
            if ((TestLog *)*plVar6 == pTVar1) {
              local_d8.m_log = pTVar1->m_log;
              lStack_d0 = plVar6[3];
              local_e8.m_log = &local_d8;
            }
            else {
              local_d8.m_log = pTVar1->m_log;
              local_e8.m_log = (TestLog *)*plVar6;
            }
            local_e0 = plVar6[1];
            *plVar6 = (long)pTVar1;
            plVar6[1] = 0;
            *(undefined1 *)&pTVar1->m_log = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_e8);
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            psVar8 = (size_type *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar8) {
              local_c8.field_2._M_allocated_capacity = *psVar8;
              local_c8.field_2._8_8_ = plVar6[3];
            }
            else {
              local_c8.field_2._M_allocated_capacity = *psVar8;
              local_c8._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_c8._M_string_length = plVar6[1];
            *plVar6 = (long)psVar8;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_c8);
            local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
            psVar8 = (size_type *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar8) {
              local_108.field_2._M_allocated_capacity = *psVar8;
              local_108.field_2._8_8_ = plVar6[3];
            }
            else {
              local_108.field_2._M_allocated_capacity = *psVar8;
              local_108._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_108._M_string_length = plVar6[1];
            *plVar6 = (long)psVar8;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            tcu::ResultCollector::fail(result,&local_108);
            goto LAB_0182e520;
          }
        }
        else {
          local_4c = puVar2[lVar9];
          glu::CallLogWrapper::glTexParameterIuiv
                    (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                     &local_4c);
          GVar4 = glu::CallLogWrapper::glGetError(gl);
          if (GVar4 == 0) goto LAB_0182e5a7;
          local_70 = local_60;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Got Error ","");
          local_48 = glu::getErrorName;
          local_40 = GVar4;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_a8,&local_48);
          uVar10 = 0xf;
          if (local_70 != local_60) {
            uVar10 = local_60[0];
          }
          if (uVar10 < local_a8._M_string_length + local_68) {
            uVar11 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              uVar11 = local_a8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar11 < local_a8._M_string_length + local_68) goto LAB_0182e2f5;
            plVar6 = (long *)std::__cxx11::string::replace
                                       ((ulong)&local_a8,0,(char *)0x0,(ulong)local_70);
          }
          else {
LAB_0182e2f5:
            plVar6 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_70,(ulong)local_a8._M_dataplus._M_p);
          }
          pTVar1 = (TestLog *)(plVar6 + 2);
          if ((TestLog *)*plVar6 == pTVar1) {
            local_d8.m_log = pTVar1->m_log;
            lStack_d0 = plVar6[3];
            local_e8.m_log = &local_d8;
          }
          else {
            local_d8.m_log = pTVar1->m_log;
            local_e8.m_log = (TestLog *)*plVar6;
          }
          local_e0 = plVar6[1];
          *plVar6 = (long)pTVar1;
          plVar6[1] = 0;
          *(undefined1 *)&pTVar1->m_log = 0;
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_e8);
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          psVar8 = puVar7 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_c8.field_2._M_allocated_capacity = *psVar8;
            local_c8.field_2._8_8_ = puVar7[3];
          }
          else {
            local_c8.field_2._M_allocated_capacity = *psVar8;
            local_c8._M_dataplus._M_p = (pointer)*puVar7;
          }
          local_c8._M_string_length = puVar7[1];
          *puVar7 = psVar8;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_c8);
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          psVar8 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_108.field_2._M_allocated_capacity = *psVar8;
            local_108.field_2._8_8_ = plVar6[3];
          }
          else {
            local_108.field_2._M_allocated_capacity = *psVar8;
            local_108._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_108._M_string_length = plVar6[1];
          *plVar6 = (long)psVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          tcu::ResultCollector::fail(result,&local_108);
LAB_0182e520:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          if (local_e8.m_log != &local_d8) {
            operator_delete(local_e8.m_log,(ulong)((long)&(local_d8.m_log)->flags + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          if (local_70 != local_60) {
            operator_delete(local_70,local_60[0] + 1);
          }
        }
LAB_0182e5a7:
        StateQueryUtil::verifyStateTextureParamInteger
                  (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                   local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar9],(this->super_TextureTest).m_type);
        lVar9 = lVar9 + 1;
      } while (lVar9 < (int)((ulong)((long)local_88.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_88.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 2));
    }
  }
  else if (0 < iVar5) {
    lVar9 = 0;
    do {
      glu::CallLogWrapper::glTexParameteri
                (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar9]);
      GVar4 = glu::CallLogWrapper::glGetError(gl);
      if (GVar4 != 0) {
        local_70 = local_60;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Got Error ","");
        local_48 = glu::getErrorName;
        local_40 = GVar4;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_a8,&local_48);
        uVar10 = 0xf;
        if (local_70 != local_60) {
          uVar10 = local_60[0];
        }
        if (uVar10 < local_a8._M_string_length + local_68) {
          uVar11 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            uVar11 = local_a8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar11 < local_a8._M_string_length + local_68) goto LAB_0182e6cb;
          plVar6 = (long *)std::__cxx11::string::replace
                                     ((ulong)&local_a8,0,(char *)0x0,(ulong)local_70);
        }
        else {
LAB_0182e6cb:
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_70,(ulong)local_a8._M_dataplus._M_p);
        }
        local_e8.m_log = &local_d8;
        pTVar1 = (TestLog *)(plVar6 + 2);
        if ((TestLog *)*plVar6 == pTVar1) {
          local_d8.m_log = pTVar1->m_log;
          lStack_d0 = plVar6[3];
        }
        else {
          local_d8.m_log = pTVar1->m_log;
          local_e8.m_log = (TestLog *)*plVar6;
        }
        local_e0 = plVar6[1];
        *plVar6 = (long)pTVar1;
        plVar6[1] = 0;
        *(undefined1 *)&pTVar1->m_log = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_e8);
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        psVar8 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_c8.field_2._M_allocated_capacity = *psVar8;
          local_c8.field_2._8_8_ = puVar7[3];
        }
        else {
          local_c8.field_2._M_allocated_capacity = *psVar8;
          local_c8._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_c8._M_string_length = puVar7[1];
        *puVar7 = psVar8;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_c8);
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        psVar8 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_108.field_2._M_allocated_capacity = *psVar8;
          local_108.field_2._8_8_ = plVar6[3];
        }
        else {
          local_108.field_2._M_allocated_capacity = *psVar8;
          local_108._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_108._M_string_length = plVar6[1];
        *plVar6 = (long)psVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        tcu::ResultCollector::fail(result,&local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        if (local_e8.m_log != &local_d8) {
          operator_delete(local_e8.m_log,(ulong)((long)&(local_d8.m_log)->flags + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if (local_70 != local_60) {
          operator_delete(local_70,local_60[0] + 1);
        }
      }
      StateQueryUtil::verifyStateTextureParamInteger
                (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar9],(this->super_TextureTest).m_type);
      lVar9 = lVar9 + 1;
      iVar5 = (int)((ulong)((long)local_88.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_88.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2);
    } while (lVar9 < iVar5);
    if (0 < iVar5) {
      lVar9 = 0;
      do {
        glu::CallLogWrapper::glTexParameterf
                  (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                   (float)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar9]);
        GVar4 = glu::CallLogWrapper::glGetError(gl);
        if (GVar4 != 0) {
          local_70 = local_60;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Got Error ","");
          local_48 = glu::getErrorName;
          local_40 = GVar4;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_a8,&local_48);
          uVar10 = 0xf;
          if (local_70 != local_60) {
            uVar10 = local_60[0];
          }
          if (uVar10 < local_a8._M_string_length + local_68) {
            uVar11 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              uVar11 = local_a8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar11 < local_a8._M_string_length + local_68) goto LAB_0182e993;
            plVar6 = (long *)std::__cxx11::string::replace
                                       ((ulong)&local_a8,0,(char *)0x0,(ulong)local_70);
          }
          else {
LAB_0182e993:
            plVar6 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_70,(ulong)local_a8._M_dataplus._M_p);
          }
          local_e8.m_log = &local_d8;
          pTVar1 = (TestLog *)(plVar6 + 2);
          if ((TestLog *)*plVar6 == pTVar1) {
            local_d8.m_log = pTVar1->m_log;
            lStack_d0 = plVar6[3];
          }
          else {
            local_d8.m_log = pTVar1->m_log;
            local_e8.m_log = (TestLog *)*plVar6;
          }
          local_e0 = plVar6[1];
          *plVar6 = (long)pTVar1;
          plVar6[1] = 0;
          *(undefined1 *)&pTVar1->m_log = 0;
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_e8);
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          psVar8 = puVar7 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_c8.field_2._M_allocated_capacity = *psVar8;
            local_c8.field_2._8_8_ = puVar7[3];
          }
          else {
            local_c8.field_2._M_allocated_capacity = *psVar8;
            local_c8._M_dataplus._M_p = (pointer)*puVar7;
          }
          local_c8._M_string_length = puVar7[1];
          *puVar7 = psVar8;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_c8);
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          psVar8 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_108.field_2._M_allocated_capacity = *psVar8;
            local_108.field_2._8_8_ = plVar6[3];
          }
          else {
            local_108.field_2._M_allocated_capacity = *psVar8;
            local_108._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_108._M_string_length = plVar6[1];
          *plVar6 = (long)psVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          tcu::ResultCollector::fail(result,&local_108);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          if (local_e8.m_log != &local_d8) {
            operator_delete(local_e8.m_log,(ulong)((long)&(local_d8.m_log)->flags + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          if (local_70 != local_60) {
            operator_delete(local_70,local_60[0] + 1);
          }
        }
        StateQueryUtil::verifyStateTextureParamInteger
                  (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                   local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar9],(this->super_TextureTest).m_type);
        lVar9 = lVar9 + 1;
      } while (lVar9 < (int)((ulong)((long)local_88.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_88.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 2));
    }
  }
  if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  tcu::TestLog::endSection(local_38.m_log);
  return;
}

Assistant:

void TextureFilterCase::test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
{
	const bool			isPureCase	= isPureIntTester(m_tester) || isPureUintTester(m_tester);
	const glw::GLenum	initial		= (m_pname == GL_TEXTURE_MAG_FILTER) ? (GL_LINEAR)
									: (m_pname == GL_TEXTURE_MIN_FILTER) ? (GL_NEAREST_MIPMAP_LINEAR)
									: (0);

	if (!isPureCase)
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, initial, m_type);
	}

	{
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "Set", "Set");
		std::vector<GLenum>			values;

		values.push_back(GL_NEAREST);
		values.push_back(GL_LINEAR);
		if (m_pname == GL_TEXTURE_MIN_FILTER)
		{
			values.push_back(GL_NEAREST_MIPMAP_NEAREST);
			values.push_back(GL_NEAREST_MIPMAP_LINEAR);
			values.push_back(GL_LINEAR_MIPMAP_NEAREST);
			values.push_back(GL_LINEAR_MIPMAP_LINEAR);
		}

		if (isPureCase)
		{
			for (int ndx = 0; ndx < (int)values.size(); ++ndx)
			{
				if (isPureIntTester(m_tester))
				{
					const glw::GLint value = (glw::GLint)values[ndx];
					gl.glTexParameterIiv(m_target, m_pname, &value);
					GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIiv");
				}
				else
				{
					DE_ASSERT(isPureUintTester(m_tester));

					const glw::GLuint value = values[ndx];
					gl.glTexParameterIuiv(m_target, m_pname, &value);
					GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIuiv");
				}

				verifyStateTextureParamInteger(result, gl, m_target, m_pname, values[ndx], m_type);
			}
		}
		else
		{
			for (int ndx = 0; ndx < (int)values.size(); ++ndx)
			{
				gl.glTexParameteri(m_target, m_pname, values[ndx]);
				GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameteri");

				verifyStateTextureParamInteger(result, gl, m_target, m_pname, values[ndx], m_type);
			}

			//check unit conversions with float

			for (int ndx = 0; ndx < (int)values.size(); ++ndx)
			{
				gl.glTexParameterf(m_target, m_pname, (GLfloat)values[ndx]);
				GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterf");

				verifyStateTextureParamInteger(result, gl, m_target, m_pname, values[ndx], m_type);
			}
		}
	}
}